

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall cmLocalGenerator::GenerateTestFiles(cmLocalGenerator *this)

{
  cmStateSnapshot *this_00;
  cmMakefile *pcVar1;
  pointer puVar2;
  pointer pbVar3;
  bool bVar4;
  string *psVar5;
  ostream *poVar6;
  cmValue cVar7;
  cmValue cVar8;
  string *i;
  pointer pbVar9;
  WrapQuotes in_R8D;
  unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_> *tester;
  pointer puVar10;
  cmStateSnapshot *i_1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  string_view str;
  string_view str_00;
  string_view str_01;
  cmStateDirectory local_378;
  cmList includesList;
  _Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> local_330;
  string resourceSpecFile;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configurationTypes;
  string file;
  string config;
  cmGeneratedFileStream fout;
  
  pcVar1 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fout,"CMAKE_TESTING_ENABLED",(allocator<char> *)&local_378);
  bVar4 = cmMakefile::IsOn(pcVar1,(string *)&fout);
  std::__cxx11::string::~string((string *)&fout);
  if (!bVar4) {
    return;
  }
  cmMakefile::GetGeneratorConfigs_abi_cxx11_(&configurationTypes,this->Makefile,OnlyMultiConfig);
  cmMakefile::GetDefaultConfiguration_abi_cxx11_(&config,this->Makefile);
  this_00 = &(this->super_cmOutputConverter).StateSnapshot;
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&fout,this_00);
  psVar5 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)&fout);
  cmStrCat<std::__cxx11::string_const&,char_const(&)[21]>
            (&file,psVar5,(char (*) [21])"/CTestTestfile.cmake");
  cmGeneratedFileStream::cmGeneratedFileStream(&fout,&file,false,None);
  cmGeneratedFileStream::SetCopyIfDifferent(&fout,true);
  poVar6 = std::operator<<((ostream *)&fout,"# CMake generated Testfile for \n# Source directory: ")
  ;
  cmStateSnapshot::GetDirectory(&local_378,this_00);
  psVar5 = cmStateDirectory::GetCurrentSource_abi_cxx11_(&local_378);
  poVar6 = std::operator<<(poVar6,(string *)psVar5);
  poVar6 = std::operator<<(poVar6,"\n# Build directory: ");
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&resourceSpecFile,this_00);
  psVar5 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)&resourceSpecFile);
  poVar6 = std::operator<<(poVar6,(string *)psVar5);
  std::operator<<(poVar6,
                  "\n# \n# This file includes the relevant testing commands required for \n# testing this directory and lists subdirectories to be tested as well.\n"
                 );
  pcVar1 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_378,"CTEST_RESOURCE_SPEC_FILE",(allocator<char> *)&includesList);
  psVar5 = cmMakefile::GetSafeDefinition(pcVar1,(string *)&local_378);
  std::__cxx11::string::string((string *)&resourceSpecFile,(string *)psVar5);
  std::__cxx11::string::~string((string *)&local_378);
  if (resourceSpecFile._M_string_length != 0) {
    poVar6 = std::operator<<((ostream *)&fout,"set(CTEST_RESOURCE_SPEC_FILE \"");
    poVar6 = std::operator<<(poVar6,(string *)&resourceSpecFile);
    std::operator<<(poVar6,"\")\n");
  }
  pcVar1 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_378,"TEST_INCLUDE_FILE",(allocator<char> *)&includesList);
  cVar7 = cmMakefile::GetProperty(pcVar1,(string *)&local_378);
  std::__cxx11::string::~string((string *)&local_378);
  if (cVar7.Value != (string *)0x0) {
    poVar6 = std::operator<<((ostream *)&fout,"include(\"");
    poVar6 = std::operator<<(poVar6,(string *)cVar7.Value);
    std::operator<<(poVar6,"\")\n");
  }
  pcVar1 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_378,"TEST_INCLUDE_FILES",(allocator<char> *)&includesList);
  cVar7 = cmMakefile::GetProperty(pcVar1,(string *)&local_378);
  std::__cxx11::string::~string((string *)&local_378);
  if (cVar7.Value != (string *)0x0) {
    std::__cxx11::string::string((string *)&local_378,(string *)cVar7.Value);
    init._M_len = 1;
    init._M_array = (iterator)&local_378;
    cmList::cmList(&includesList,init);
    std::__cxx11::string::~string((string *)&local_378);
    pbVar3 = includesList.Values.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar9 = includesList.Values.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar9 != pbVar3; pbVar9 = pbVar9 + 1)
    {
      poVar6 = std::operator<<((ostream *)&fout,"include(\"");
      poVar6 = std::operator<<(poVar6,(string *)pbVar9);
      std::operator<<(poVar6,"\")\n");
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&includesList.Values);
  }
  puVar2 = (this->Makefile->TestGenerators).
           super__Vector_base<std::unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_>,_std::allocator<std::unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar10 = (this->Makefile->TestGenerators).
                 super__Vector_base<std::unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_>,_std::allocator<std::unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar10 != puVar2; puVar10 = puVar10 + 1
      ) {
    cmTestGenerator::Compute
              ((puVar10->_M_t).
               super___uniq_ptr_impl<cmTestGenerator,_std::default_delete<cmTestGenerator>_>._M_t.
               super__Tuple_impl<0UL,_cmTestGenerator_*,_std::default_delete<cmTestGenerator>_>.
               super__Head_base<0UL,_cmTestGenerator_*,_false>._M_head_impl,this);
    cmScriptGenerator::Generate
              (&((puVar10->_M_t).
                 super___uniq_ptr_impl<cmTestGenerator,_std::default_delete<cmTestGenerator>_>._M_t.
                 super__Tuple_impl<0UL,_cmTestGenerator_*,_std::default_delete<cmTestGenerator>_>.
                 super__Head_base<0UL,_cmTestGenerator_*,_false>._M_head_impl)->
                super_cmScriptGenerator,(ostream *)&fout,&config,&configurationTypes);
  }
  cmMakefile::GetStateSnapshot(this->Makefile);
  cmStateSnapshot::GetChildren
            ((vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *)&local_330,
             (cmStateSnapshot *)&local_378);
  for (; local_330._M_impl.super__Vector_impl_data._M_start !=
         local_330._M_impl.super__Vector_impl_data._M_finish;
      local_330._M_impl.super__Vector_impl_data._M_start =
           local_330._M_impl.super__Vector_impl_data._M_start + 1) {
    cmStateSnapshot::GetDirectory(&local_378,local_330._M_impl.super__Vector_impl_data._M_start);
    psVar5 = cmStateDirectory::GetCurrentBinary_abi_cxx11_(&local_378);
    std::__cxx11::string::string((string *)&includesList,(string *)psVar5);
    cmOutputConverter::MaybeRelativeToCurBinDir
              ((string *)&local_378,&this->super_cmOutputConverter,(string *)&includesList);
    std::__cxx11::string::operator=((string *)&includesList,(string *)&local_378);
    std::__cxx11::string::~string((string *)&local_378);
    str._M_str = (char *)0x0;
    str._M_len = (size_t)includesList.Values.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
    cmOutputConverter::EscapeForCMake_abi_cxx11_
              ((string *)&local_378,
               (cmOutputConverter *)
               includesList.Values.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,str,in_R8D);
    std::__cxx11::string::operator=((string *)&includesList,(string *)&local_378);
    std::__cxx11::string::~string((string *)&local_378);
    poVar6 = std::operator<<((ostream *)&fout,"subdirs(");
    poVar6 = std::operator<<(poVar6,(string *)&includesList);
    std::operator<<(poVar6,")\n");
    std::__cxx11::string::~string((string *)&includesList);
  }
  pcVar1 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_378,"CMAKE_DIRECTORY_LABELS",(allocator<char> *)&includesList);
  cVar7 = cmMakefile::GetDefinition(pcVar1,(string *)&local_378);
  std::__cxx11::string::~string((string *)&local_378);
  pcVar1 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_378,"LABELS",(allocator<char> *)&includesList);
  cVar8 = cmMakefile::GetProperty(pcVar1,(string *)&local_378);
  std::__cxx11::string::~string((string *)&local_378);
  if (cVar8.Value == (string *)0x0 && cVar7.Value == (string *)0x0) goto LAB_0021b022;
  std::operator<<((ostream *)&fout,"set_directory_properties(PROPERTIES LABELS ");
  if (cVar8.Value == (string *)0x0) {
    if (cVar7.Value != (string *)0x0) goto LAB_0021afdf;
  }
  else {
    str_00._M_str = (char *)0x0;
    str_00._M_len = (size_t)((cVar8.Value)->_M_dataplus)._M_p;
    cmOutputConverter::EscapeForCMake_abi_cxx11_
              ((string *)&local_378,(cmOutputConverter *)(cVar8.Value)->_M_string_length,str_00,
               in_R8D);
    std::operator<<((ostream *)&fout,(string *)&local_378);
    std::__cxx11::string::~string((string *)&local_378);
    if (cVar7.Value != (string *)0x0) {
      std::operator<<((ostream *)&fout,";");
LAB_0021afdf:
      str_01._M_str = (char *)0x0;
      str_01._M_len = (size_t)((cVar7.Value)->_M_dataplus)._M_p;
      cmOutputConverter::EscapeForCMake_abi_cxx11_
                ((string *)&local_378,(cmOutputConverter *)(cVar7.Value)->_M_string_length,str_01,
                 in_R8D);
      std::operator<<((ostream *)&fout,(string *)&local_378);
      std::__cxx11::string::~string((string *)&local_378);
    }
  }
  std::operator<<((ostream *)&fout,")\n");
LAB_0021b022:
  std::_Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::~_Vector_base(&local_330);
  std::__cxx11::string::~string((string *)&resourceSpecFile);
  cmGeneratedFileStream::~cmGeneratedFileStream(&fout);
  std::__cxx11::string::~string((string *)&file);
  std::__cxx11::string::~string((string *)&config);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&configurationTypes);
  return;
}

Assistant:

void cmLocalGenerator::GenerateTestFiles()
{
  if (!this->Makefile->IsOn("CMAKE_TESTING_ENABLED")) {
    return;
  }

  // Compute the set of configurations.
  std::vector<std::string> configurationTypes =
    this->Makefile->GetGeneratorConfigs(cmMakefile::OnlyMultiConfig);
  std::string config = this->Makefile->GetDefaultConfiguration();

  std::string file =
    cmStrCat(this->StateSnapshot.GetDirectory().GetCurrentBinary(),
             "/CTestTestfile.cmake");

  cmGeneratedFileStream fout(file);
  fout.SetCopyIfDifferent(true);

  fout << "# CMake generated Testfile for \n"
          "# Source directory: "
       << this->StateSnapshot.GetDirectory().GetCurrentSource()
       << "\n"
          "# Build directory: "
       << this->StateSnapshot.GetDirectory().GetCurrentBinary()
       << "\n"
          "# \n"
          "# This file includes the relevant testing commands "
          "required for \n"
          "# testing this directory and lists subdirectories to "
          "be tested as well.\n";

  std::string resourceSpecFile =
    this->Makefile->GetSafeDefinition("CTEST_RESOURCE_SPEC_FILE");
  if (!resourceSpecFile.empty()) {
    fout << "set(CTEST_RESOURCE_SPEC_FILE \"" << resourceSpecFile << "\")\n";
  }

  cmValue testIncludeFile = this->Makefile->GetProperty("TEST_INCLUDE_FILE");
  if (testIncludeFile) {
    fout << "include(\"" << *testIncludeFile << "\")\n";
  }

  cmValue testIncludeFiles = this->Makefile->GetProperty("TEST_INCLUDE_FILES");
  if (testIncludeFiles) {
    cmList includesList{ *testIncludeFiles };
    for (std::string const& i : includesList) {
      fout << "include(\"" << i << "\")\n";
    }
  }

  // Ask each test generator to write its code.
  for (const auto& tester : this->Makefile->GetTestGenerators()) {
    tester->Compute(this);
    tester->Generate(fout, config, configurationTypes);
  }
  using vec_t = std::vector<cmStateSnapshot>;
  vec_t const& children = this->Makefile->GetStateSnapshot().GetChildren();
  for (cmStateSnapshot const& i : children) {
    // TODO: Use add_subdirectory instead?
    std::string outP = i.GetDirectory().GetCurrentBinary();
    outP = this->MaybeRelativeToCurBinDir(outP);
    outP = cmOutputConverter::EscapeForCMake(outP);
    fout << "subdirs(" << outP << ")\n";
  }

  // Add directory labels property
  cmValue directoryLabels =
    this->Makefile->GetDefinition("CMAKE_DIRECTORY_LABELS");
  cmValue labels = this->Makefile->GetProperty("LABELS");

  if (labels || directoryLabels) {
    fout << "set_directory_properties(PROPERTIES LABELS ";
    if (labels) {
      fout << cmOutputConverter::EscapeForCMake(*labels);
    }
    if (labels && directoryLabels) {
      fout << ";";
    }
    if (directoryLabels) {
      fout << cmOutputConverter::EscapeForCMake(*directoryLabels);
    }
    fout << ")\n";
  }
}